

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.h
# Opt level: O2

void __thiscall
spvtools::opt::LoopPeeling::LoopPeeling
          (LoopPeeling *this,Loop *loop,Instruction *loop_iteration_count,
          Instruction *canonical_induction_variable)

{
  IRContext *context;
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t uVar4;
  TypeManager *this_00;
  Type *pTVar5;
  undefined4 extraout_var;
  Instruction *pIVar6;
  
  context = loop->context_;
  this->context_ = context;
  LoopUtils::LoopUtils(&this->loop_utils_,context,loop);
  this->loop_ = loop;
  bVar1 = Loop::IsInsideLoop(loop,loop_iteration_count);
  pIVar6 = (Instruction *)0x0;
  if (!bVar1) {
    pIVar6 = loop_iteration_count;
  }
  this->loop_iteration_count_ = pIVar6;
  this->int_type_ = (Integer *)0x0;
  this->original_loop_canonical_induction_variable_ = canonical_induction_variable;
  this->canonical_induction_variable_ = (Instruction *)0x0;
  (this->exit_value_)._M_h._M_buckets = &(this->exit_value_)._M_h._M_single_bucket;
  (this->exit_value_)._M_h._M_bucket_count = 1;
  (this->exit_value_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->exit_value_)._M_h._M_element_count = 0;
  (this->exit_value_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->exit_value_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->exit_value_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (pIVar6 != (Instruction *)0x0) {
    this_00 = IRContext::get_type_mgr(this->context_);
    uVar2 = Instruction::type_id(this->loop_iteration_count_);
    pTVar5 = analysis::TypeManager::GetType(this_00,uVar2);
    iVar3 = (*pTVar5->_vptr_Type[9])(pTVar5);
    this->int_type_ = (Integer *)CONCAT44(extraout_var,iVar3);
    if (this->canonical_induction_variable_ != (Instruction *)0x0) {
      uVar2 = Instruction::type_id(this->canonical_induction_variable_);
      uVar4 = Instruction::type_id(this->loop_iteration_count_);
      if (uVar2 != uVar4) {
        __assert_fail("canonical_induction_variable_->type_id() == loop_iteration_count_->type_id() && \"loop_iteration_count and canonical_induction_variable do not \" \"have the same type\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.h"
                      ,99,
                      "spvtools::opt::LoopPeeling::LoopPeeling(Loop *, Instruction *, Instruction *)"
                     );
      }
    }
  }
  GetIteratingExitValues(this);
  return;
}

Assistant:

LoopPeeling(Loop* loop, Instruction* loop_iteration_count,
              Instruction* canonical_induction_variable = nullptr)
      : context_(loop->GetContext()),
        loop_utils_(loop->GetContext(), loop),
        loop_(loop),
        loop_iteration_count_(!loop->IsInsideLoop(loop_iteration_count)
                                  ? loop_iteration_count
                                  : nullptr),
        int_type_(nullptr),
        original_loop_canonical_induction_variable_(
            canonical_induction_variable),
        canonical_induction_variable_(nullptr) {
    if (loop_iteration_count_) {
      int_type_ = context_->get_type_mgr()
                      ->GetType(loop_iteration_count_->type_id())
                      ->AsInteger();
      if (canonical_induction_variable_) {
        assert(canonical_induction_variable_->type_id() ==
                   loop_iteration_count_->type_id() &&
               "loop_iteration_count and canonical_induction_variable do not "
               "have the same type");
      }
    }
    GetIteratingExitValues();
  }